

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O1

void __thiscall
ConfidentialTransaction_ScriptWitnessTest_Test::~ConfidentialTransaction_ScriptWitnessTest_Test
          (ConfidentialTransaction_ScriptWitnessTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConfidentialTransaction, ScriptWitnessTest) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  const ByteData exp_data("1234567890");
  const ByteData160 exp_data160("1234567890123456789012345678901234567890");
  const ByteData256 exp_data256(
      "1234567890123456789012345678901234567890123456789012345678901234");
  const std::vector<ByteData>& exp_wit_vector = exp_witness_stack.GetWitness();
  ByteData256 witness_only_hash;

  ConfidentialTransaction tx(exp_tx_hex);
  uint32_t index = 0;
  EXPECT_NO_THROW(
      (index = tx.AddTxIn(exp_txid, exp_index, exp_sequence, exp_script)));
  EXPECT_NO_THROW(
      (tx.SetIssuance(index, exp_blinding_nonce, exp_asset_entropy,
                      exp_issuance_amount, exp_inflation_keys,
                      exp_issuance_amount_rangeproof,
                      exp_inflation_keys_rangeproof)));
  EXPECT_EQ(tx.GetScriptWitnessStackNum(index), 0);

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "5e1940c383c21cc75720f61fcc7cf95a056239ce73d5bd1cee1ff0c578bbcf99");

  // AddScriptWitnessStack
  ScriptWitness witness;
  for (size_t idx = 0; idx < exp_wit_vector.size(); ++idx) {
    EXPECT_NO_THROW(
        (witness = tx.AddScriptWitnessStack(index, exp_wit_vector[idx])));
  }
  std::vector<ByteData> test_wit_vector = witness.GetWitness();
  for (size_t idx = 0; idx < exp_wit_vector.size(); ++idx) {
    EXPECT_STREQ(test_wit_vector[idx].GetHex().c_str(),
                 exp_wit_vector[idx].GetHex().c_str());
  }
  std::vector<ByteData> tx_wit_vector = tx.GetTxIn(index).GetScriptWitness()
      .GetWitness();
  for (size_t idx = 0; idx < tx_wit_vector.size(); ++idx) {
    EXPECT_STREQ(test_wit_vector[idx].GetHex().c_str(),
                 tx_wit_vector[idx].GetHex().c_str());
  }
  EXPECT_EQ(tx.GetScriptWitnessStackNum(index), exp_wit_vector.size());

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "17bd17d4d6122c1ffc8c5cbbaa3ac33051f50a85a09dbaa8c52f98ef21f3e5df");

  // AddScriptWitnessStack(160,256)
  EXPECT_THROW((witness = tx.AddScriptWitnessStack(index + 5, exp_data160)),
               CfdException);
  EXPECT_NO_THROW((witness = tx.AddScriptWitnessStack(index, exp_data160)));
  EXPECT_NO_THROW((witness = tx.AddScriptWitnessStack(index, exp_data256)));
  test_wit_vector = witness.GetWitness();
  EXPECT_STREQ(test_wit_vector[exp_wit_vector.size()].GetHex().c_str(),
               exp_data160.GetHex().c_str());
  EXPECT_STREQ(test_wit_vector[exp_wit_vector.size() + 1].GetHex().c_str(),
               exp_data256.GetHex().c_str());
  EXPECT_EQ(tx.GetScriptWitnessStackNum(index), exp_wit_vector.size() + 2);

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "8088774d9f59f484294dfd11cac751c33166becdcb8fb89856fab90b0c81e92f");

  // SetScriptWitnessStack
  EXPECT_THROW(
      (witness = tx.SetScriptWitnessStack(index + 5, static_cast<size_t>(exp_wit_vector.size()),
                                          exp_data160)),
      CfdException);
  EXPECT_THROW(
      (witness = tx.SetScriptWitnessStack(index, static_cast<size_t>(exp_wit_vector.size()) + 5,
                                          exp_data160)),
      CfdException);
  EXPECT_NO_THROW((witness = tx.SetScriptWitnessStack(index, 0, exp_data)));
  EXPECT_NO_THROW(
      (witness = tx.SetScriptWitnessStack(index, static_cast<size_t>(exp_wit_vector.size()),
                                          exp_data256)));
  EXPECT_NO_THROW(
      (witness = tx.SetScriptWitnessStack(index, static_cast<size_t>(exp_wit_vector.size()) + 1,
                                          exp_data160)));
  test_wit_vector = witness.GetWitness();
  EXPECT_STREQ(test_wit_vector[0].GetHex().c_str(), exp_data.GetHex().c_str());
  EXPECT_STREQ(test_wit_vector[exp_wit_vector.size()].GetHex().c_str(),
               exp_data256.GetHex().c_str());
  EXPECT_STREQ(test_wit_vector[exp_wit_vector.size() + 1].GetHex().c_str(),
               exp_data160.GetHex().c_str());
  tx_wit_vector = tx.GetTxIn(index).GetScriptWitness().GetWitness();
  for (size_t idx = 0; idx < tx_wit_vector.size(); ++idx) {
    EXPECT_STREQ(test_wit_vector[idx].GetHex().c_str(),
                 tx_wit_vector[idx].GetHex().c_str());
  }

  EXPECT_NO_THROW(
    (witness_only_hash = tx.GetWitnessOnlyHash()));
  EXPECT_STREQ(
    witness_only_hash.GetHex().c_str(),
    "939475f226f92b9b06810fe472e73cb02a1402be2f17f815c0ddf7e103373c0f");

  // RemoveScriptWitnessStackAll
  EXPECT_THROW((tx.RemoveScriptWitnessStackAll(index + 5)), CfdException);
  EXPECT_NO_THROW((tx.RemoveScriptWitnessStackAll(index)));
  EXPECT_EQ(tx.GetScriptWitnessStackNum(index), 0);
}